

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

void JSON::writeNext(Pipeline *p,bool *first,size_t depth)

{
  allocator<char> local_79;
  undefined1 local_78 [8];
  string s_1;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string s;
  size_t depth_local;
  bool *first_local;
  Pipeline *p_local;
  
  s.field_2._8_8_ = depth;
  if ((*first & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_78,",\n",&local_79);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::append((ulong)local_78,(char)s.field_2._8_8_ * '\x02');
    Pipeline::operator<<(p,(string *)local_78);
    std::__cxx11::string::~string((string *)local_78);
  }
  else {
    *first = false;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"\n",&local_41);
    std::allocator<char>::~allocator(&local_41);
    std::__cxx11::string::append((ulong)local_40,(char)s.field_2._8_8_ * '\x02');
    Pipeline::operator<<(p,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void
JSON::writeNext(Pipeline* p, bool& first, size_t depth)
{
    if (first) {
        first = false;
        std::string s{"\n"};
        s.append(2 * depth, ' ');
        *p << s;
    } else {
        std::string s{",\n"};
        s.append(2 * depth, ' ');
        *p << s;
    }
}